

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O1

bool megumax::legal_pv(Position *pos,MoveList *move_list)

{
  pointer pMVar1;
  pointer pMVar2;
  bool bVar3;
  MoveList *__range1;
  int iVar4;
  pointer pMVar5;
  int iVar6;
  
  pMVar1 = (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pMVar1 == pMVar2) {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    do {
      pMVar5 = pMVar1 + 1;
      bVar3 = libchess::Position::is_legal_move(pos,(Move)pMVar1->value_);
      if (bVar3) {
        libchess::Position::make_move(pos,(Move)pMVar1->value_);
        iVar6 = iVar6 + 1;
      }
      pMVar1 = pMVar5;
    } while (bVar3 && pMVar5 != pMVar2);
  }
  iVar4 = iVar6;
  if (0 < iVar6) {
    do {
      libchess::Position::unmake_move(pos);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return iVar6 == (int)((ulong)((long)(move_list->values_).
                                      super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(move_list->values_).
                                     super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2);
}

Assistant:

bool legal_pv(Position& pos, MoveList&& move_list) {
    int ply = 0;

    for (const auto& move : move_list) {
        if (pos.is_legal_move(move)) {
            pos.make_move(move);
            ply++;
        } else {
            break;
        }
    }

    for (int i = 0; i < ply; ++i) {
        pos.unmake_move();
    }

    return ply == move_list.size();
}